

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffers.h
# Opt level: O3

void __thiscall flatbuffers::FlatBufferBuilder::Align(FlatBufferBuilder *this,size_t elem_size)

{
  uint8_t *__s;
  ulong uVar1;
  
  if (this->minalign_ < elem_size) {
    this->minalign_ = elem_size;
  }
  uVar1 = -(ulong)(uint)(((int)(this->buf_).reserved_ - *(int *)&(this->buf_).cur_) +
                        *(int *)&(this->buf_).buf_);
  __s = vector_downward::make_space(&this->buf_,elem_size - 1 & uVar1);
  uVar1 = elem_size - 1 & uVar1;
  if (uVar1 != 0) {
    memset(__s,0,uVar1);
    return;
  }
  return;
}

Assistant:

void Align(size_t elem_size) {
    if (elem_size > minalign_) minalign_ = elem_size;
    buf_.fill(PaddingBytes(buf_.size(), elem_size));
  }